

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O2

char * litString(char *str)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  
  if (str != (char *)0x0) {
    sVar2 = strlen(str);
    pcVar3 = (char *)get_ioblob(sVar2 * 2 + 2);
    *pcVar3 = '\"';
    pcVar4 = pcVar3;
    while( true ) {
      pcVar4 = pcVar4 + 1;
      while( true ) {
        cVar1 = *str;
        str = str + 1;
        if (cVar1 != '\"') break;
        pcVar4[0] = '\\';
        pcVar4[1] = '\"';
        pcVar4 = pcVar4 + 2;
      }
      if (cVar1 == '\0') break;
      *pcVar4 = cVar1;
    }
    pcVar4[0] = '\"';
    pcVar4[1] = '\0';
    return pcVar3;
  }
  return "NULL";
}

Assistant:

const char *litString(const char *str)
{
    if (str) {
        const size_t slen = (strlen(str) + 1) * 2;
        char *retval = (char *) get_ioblob(slen);
        char *ptr = retval;
        *(ptr++) = '"';
        while (1) {
            const char ch = *(str++);
            if (ch == '\0') {
                *(ptr++) = '"';
                *(ptr++) = '\0';
                break;
            } else if (ch == '"') {
                *(ptr++) = '\\';
                *(ptr++) = '"';
            } else {
                *(ptr++) = ch;
            }
        }
        return retval;
    }
    return "NULL";
}